

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<int,_allocator_default<int>_>::clear(array<int,_allocator_default<int>_> *this)

{
  int *piVar1;
  
  if (this->list != (int *)0x0) {
    operator_delete__(this->list);
  }
  this->list_size = 1;
  piVar1 = (int *)operator_new__(4);
  this->list = piVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}